

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_196f0::IDLExportVisitor::visit_(IDLExportVisitor *this,Compound *type)

{
  pointer pcVar1;
  ostream *poVar2;
  Indent indenter;
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  char local_60 [8];
  char local_58 [16];
  string local_48;
  
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->m_stream,(this->m_indent)._M_dataplus._M_p,
                      (this->m_indent)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"struct ",7);
  Typelib::Type::getBasename_abi_cxx11_();
  normalizeIDLName((string *)local_70,&local_48);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_70,(long)local_68._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," {\n",3);
  if (local_70 != (undefined1  [8])local_60) {
    operator_delete((void *)local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_68._M_p = local_58;
  pcVar1 = (this->m_indent)._M_dataplus._M_p;
  local_70 = (undefined1  [8])&this->m_indent;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (this->m_indent)._M_string_length);
  std::__cxx11::string::append((char *)local_70);
  Typelib::TypeVisitor::visit_((Compound *)this);
  Indent::~Indent((Indent *)local_70);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->m_stream,(this->m_indent)._M_dataplus._M_p,
                      (this->m_indent)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"};\n",3);
  return true;
}

Assistant:

bool IDLExportVisitor::visit_(Compound const& type)
    {
        m_stream << m_indent << "struct " << normalizeIDLName(type.getBasename()) << " {\n";

        { Indent indenter(m_indent);
            TypeVisitor::visit_(type);
        }

        m_stream << m_indent
            << "};\n";

        return true;
    }